

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
CustomLayerParams_CustomLayerParamValue
          (CustomLayerParams_CustomLayerParamValue *this,
          CustomLayerParams_CustomLayerParamValue *from)

{
  uint32 uVar1;
  int32 iVar2;
  void *pvVar3;
  ValueUnion VVar4;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CustomLayerParams_CustomLayerParamValue_00725ce0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 0x1e) {
    if (uVar1 == 10) {
      if (uVar1 == 10) {
        VVar4 = from->value_;
      }
      else {
        VVar4.doublevalue_ = 0.0;
      }
      clear_value(this);
      this->_oneof_case_[0] = 10;
      (this->value_).doublevalue_ = (double)VVar4;
    }
    else if (uVar1 == 0x14) {
      VVar4 = (ValueUnion)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if (uVar1 == 0x14) {
        VVar4 = from->value_;
      }
      clear_value(this);
      this->_oneof_case_[0] = 0x14;
      this->value_ = (ValueUnion)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&(this->value_).stringvalue_,(string *)VVar4);
    }
  }
  else if (uVar1 == 0x1e) {
    iVar2 = (from->value_).intvalue_;
    clear_value(this);
    this->_oneof_case_[0] = 0x1e;
    (this->value_).intvalue_ = iVar2;
  }
  else if (uVar1 == 0x28) {
    if (uVar1 == 0x28) {
      VVar4 = from->value_;
    }
    else {
      VVar4.doublevalue_ = 0.0;
    }
    clear_value(this);
    this->_oneof_case_[0] = 0x28;
    this->value_ = VVar4;
  }
  else if (uVar1 == 0x32) {
    iVar2 = (from->value_).intvalue_;
    clear_value(this);
    this->_oneof_case_[0] = 0x32;
    (this->value_).boolvalue_ = SUB41(iVar2,0);
  }
  return;
}

Assistant:

CustomLayerParams_CustomLayerParamValue::CustomLayerParams_CustomLayerParamValue(const CustomLayerParams_CustomLayerParamValue& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_value();
  switch (from.value_case()) {
    case kDoubleValue: {
      set_doublevalue(from.doublevalue());
      break;
    }
    case kStringValue: {
      set_stringvalue(from.stringvalue());
      break;
    }
    case kIntValue: {
      set_intvalue(from.intvalue());
      break;
    }
    case kLongValue: {
      set_longvalue(from.longvalue());
      break;
    }
    case kBoolValue: {
      set_boolvalue(from.boolvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
}